

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

us_socket_context_t *
us_create_socket_context
          (int ssl,us_loop_t *loop,int context_ext_size,us_socket_context_options_t options)

{
  us_socket_context_options_t options_00;
  int in_EDX;
  us_loop_t *in_RSI;
  int in_EDI;
  char *pcStack0000000000000008;
  char *pcStack0000000000000010;
  char *pcStack0000000000000018;
  int in_stack_00000024;
  us_loop_t *in_stack_00000028;
  us_socket_context_t *context;
  undefined4 in_stack_00000058;
  undefined8 uStack0000000000000060;
  undefined4 uStack0000000000000068;
  undefined4 uStack000000000000006c;
  char *in_stack_ffffffffffffffa8;
  us_internal_ssl_socket_context_t *local_8;
  
  deep_str_copy(in_stack_ffffffffffffffa8);
  pcStack0000000000000010 = deep_str_copy(in_stack_ffffffffffffffa8);
  deep_str_copy(in_stack_ffffffffffffffa8);
  pcStack0000000000000008 = deep_str_copy(in_stack_ffffffffffffffa8);
  pcStack0000000000000018 = deep_str_copy(in_stack_ffffffffffffffa8);
  if (in_EDI == 0) {
    local_8 = (us_internal_ssl_socket_context_t *)malloc((long)in_EDX + 0x90);
    (local_8->sc).loop = in_RSI;
    (local_8->sc).head = (us_socket_t *)0x0;
    (local_8->sc).iterator = (us_socket_t *)0x0;
    (local_8->sc).next = (us_socket_context_t *)0x0;
    (local_8->sc).ignore_data = default_ignore_data_handler;
    memcpy(&(local_8->sc).options,&stack0x00000008,0x30);
    us_internal_loop_link(in_RSI,(us_socket_context_t *)local_8);
  }
  else {
    options_00.cert_file_name._4_4_ = context_ext_size;
    options_00._0_12_ = _context;
    options_00.passphrase = (char *)loop;
    options_00.dh_params_file_name._0_4_ = in_stack_00000058;
    options_00.dh_params_file_name._4_4_ = ssl;
    options_00.ca_file_name = (char *)uStack0000000000000060;
    options_00.ssl_prefer_low_memory_usage = uStack0000000000000068;
    options_00._44_4_ = uStack000000000000006c;
    local_8 = us_internal_create_ssl_socket_context(in_stack_00000028,in_stack_00000024,options_00);
  }
  return &local_8->sc;
}

Assistant:

struct us_socket_context_t *us_create_socket_context(int ssl, struct us_loop_t *loop, int context_ext_size, struct us_socket_context_options_t options) {
    /* For ease of use we copy all passed strings here */
    options.ca_file_name = deep_str_copy(options.ca_file_name);
    options.cert_file_name = deep_str_copy(options.cert_file_name);
    options.dh_params_file_name = deep_str_copy(options.dh_params_file_name);
    options.key_file_name = deep_str_copy(options.key_file_name);
    options.passphrase = deep_str_copy(options.passphrase);

#ifndef LIBUS_NO_SSL
    if (ssl) {
        return (struct us_socket_context_t *) us_internal_create_ssl_socket_context(loop, context_ext_size, options);
    }
#endif

    struct us_socket_context_t *context = malloc(sizeof(struct us_socket_context_t) + context_ext_size);
    context->loop = loop;
    context->head = 0;
    context->iterator = 0;
    context->next = 0;
    context->ignore_data = default_ignore_data_handler;
    context->options = options;

    us_internal_loop_link(loop, context);
    return context;
}